

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int uv__try_write(uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  msghdr msg;
  undefined8 local_128;
  undefined8 local_120;
  int local_118 [60];
  
  uVar1 = uv__getiovmax();
  if ((int)uVar1 < (int)nbufs) {
    nbufs = uVar1;
  }
  if (send_handle == (uv_stream_t *)0x0) {
    do {
      iVar2 = (stream->io_watcher).fd;
      if (nbufs == 1) {
        uVar3 = write(iVar2,bufs->base,bufs->len);
      }
      else {
        uVar3 = writev(iVar2,(iovec *)bufs,nbufs);
      }
      if (uVar3 != 0xffffffffffffffff) goto LAB_00168332;
      piVar4 = __errno_location();
      iVar2 = *piVar4;
    } while (iVar2 == 4);
  }
  else {
    if ((send_handle->flags & 3) != 0) {
      uVar3 = 0xfffffffffffffff7;
      goto LAB_00168351;
    }
    iVar2 = uv__handle_fd((uv_handle_t *)send_handle);
    memset(local_118,0,0xf0);
    if (iVar2 < 0) {
      __assert_fail("fd_to_send >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/stream.c"
                    ,0x317,
                    "int uv__try_write(uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *)"
                   );
    }
    msg.msg_name = (void *)0x0;
    msg.msg_namelen = 0;
    msg.msg_iovlen = (size_t)(int)nbufs;
    msg.msg_flags = 0;
    msg.msg_control = &local_128;
    msg.msg_controllen = 0x18;
    local_120 = 0x100000001;
    local_128 = 0x14;
    msg.msg_iov = (iovec *)bufs;
    local_118[0] = iVar2;
    do {
      uVar3 = sendmsg((stream->io_watcher).fd,(msghdr *)&msg,0);
      if (uVar3 != 0xffffffffffffffff) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
LAB_00168332:
    if (-1 < (long)uVar3) goto LAB_00168351;
    piVar4 = __errno_location();
    iVar2 = *piVar4;
  }
  uVar3 = 0xfffffffffffffff5;
  if ((iVar2 != 0xb) && (iVar2 != 0x69)) {
    uVar3 = (ulong)(uint)-iVar2;
  }
LAB_00168351:
  return (int)uVar3;
}

Assistant:

static int uv__try_write(uv_stream_t* stream,
                         const uv_buf_t bufs[],
                         unsigned int nbufs,
                         uv_stream_t* send_handle) {
  struct iovec* iov;
  int iovmax;
  int iovcnt;
  ssize_t n;

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  iov = (struct iovec*) bufs;
  iovcnt = nbufs;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */
  if (send_handle != NULL) {
    int fd_to_send;
    struct msghdr msg;
    union uv__cmsg cmsg;

    if (uv__is_closing(send_handle))
      return UV_EBADF;

    fd_to_send = uv__handle_fd((uv_handle_t*) send_handle);

    memset(&cmsg, 0, sizeof(cmsg));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &cmsg.hdr;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg.hdr.cmsg_level = SOL_SOCKET;
    cmsg.hdr.cmsg_type = SCM_RIGHTS;
    cmsg.hdr.cmsg_len = CMSG_LEN(sizeof(fd_to_send));
    memcpy(CMSG_DATA(&cmsg.hdr), &fd_to_send, sizeof(fd_to_send));

    do
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    while (n == -1 && errno == EINTR);
  } else {
    do
      n = uv__writev(uv__stream_fd(stream), iov, iovcnt);
    while (n == -1 && errno == EINTR);
  }

  if (n >= 0)
    return n;

  if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
    return UV_EAGAIN;

#ifdef __APPLE__
  /* macOS versions 10.10 and 10.15 - and presumbaly 10.11 to 10.14, too -
   * have a bug where a race condition causes the kernel to return EPROTOTYPE
   * because the socket isn't fully constructed. It's probably the result of
   * the peer closing the connection and that is why libuv translates it to
   * ECONNRESET. Previously, libuv retried until the EPROTOTYPE error went
   * away but some VPN software causes the same behavior except the error is
   * permanent, not transient, turning the retry mechanism into an infinite
   * loop. See https://github.com/libuv/libuv/pull/482.
   */
  if (errno == EPROTOTYPE)
    return UV_ECONNRESET;
#endif  /* __APPLE__ */

  return UV__ERR(errno);
}